

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters.c
# Opt level: O3

void ihevc_intra_pred_ref_filtering
               (UWORD8 *pu1_src,WORD32 nt,UWORD8 *pu1_dst,WORD32 mode,
               WORD32 strong_intra_smoothing_enable_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  undefined1 in_XMM0 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  long lVar41;
  undefined1 auVar42 [16];
  long lVar56;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  UWORD8 au1_flt [257];
  byte local_138 [80];
  undefined1 auStack_e8 [184];
  
  uVar26 = nt * 4;
  iVar4 = 0;
  if (nt != 0) {
    for (; ((uint)nt >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
    }
  }
  uVar27 = 1 << ((char)iVar4 - 2U & 0x1f);
  if (nt == 0) {
    uVar27 = 0;
  }
  if ((uVar27 & "\x0e"[mode]) == 0) {
    if (nt < 0 || pu1_src == pu1_dst) {
      return;
    }
    uVar24 = 0;
    if ((int)uVar26 < 1) {
      uVar26 = 0;
    }
    do {
      pu1_dst[uVar24] = pu1_src[uVar24];
      uVar24 = uVar24 + 1;
    } while ((uVar26 | 1) != uVar24);
    return;
  }
  if (nt == 0x20 && strong_intra_smoothing_enable_flag == 1) {
    bVar1 = pu1_src[0x40];
    bVar2 = pu1_src[uVar26];
    uVar27 = (uint)bVar2 + (uint)bVar1 + (uint)pu1_src[0x60] * -2;
    uVar20 = -uVar27;
    if (0 < (int)uVar27) {
      uVar20 = uVar27;
    }
    bVar3 = *pu1_src;
    uVar27 = (uint)bVar3;
    uVar28 = (uint)bVar3 + (uint)bVar1 + (uint)pu1_src[0x20] * -2;
    uVar21 = -uVar28;
    if (0 < (int)uVar28) {
      uVar21 = uVar28;
    }
    local_138[0] = bVar3;
    local_138[uVar26] = bVar2;
    if ((uVar21 < 8) && (uVar20 < 8)) {
      iVar23 = (uint)bVar1 * 0x10;
      uVar27 = (uint)bVar1;
      iVar4 = (uint)bVar1 * 10;
      auVar31 = pmovsxbq(in_XMM0,0xf0e);
      auVar32 = pmovsxbq(in_XMM1,0xd0c);
      auVar33 = pmovsxbq(in_XMM2,0xb0a);
      auVar34 = pmovsxbq(in_XMM3,0x908);
      auVar35 = pmovsxbq(in_XMM4,0x706);
      auVar36 = pmovsxbq(in_XMM5,0x504);
      auVar37 = pmovsxbq(in_XMM6,0x302);
      auVar38 = pmovsxbq(in_XMM7,0x100);
      iVar22 = 0;
      lVar30 = 0;
      local_138[0x40] = bVar1;
      do {
        auVar39._8_4_ = (int)lVar30;
        auVar39._0_8_ = lVar30;
        auVar39._12_4_ = (int)((ulong)lVar30 >> 0x20);
        auVar42 = (auVar39 | auVar38) ^ _DAT_001721d0;
        lVar41 = auVar42._0_8_;
        auVar44._0_8_ = -(ulong)(lVar41 < -0x7fffffffffffffc1);
        lVar56 = auVar42._8_8_;
        auVar44._8_8_ = -(ulong)(lVar56 < -0x7fffffffffffffc1);
        auVar42 = pshuflw(auVar44,auVar44,0xe8);
        auVar42 = packssdw(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138[lVar30 + 1] =
               (byte)(((uint)bVar3 * 0x40 - (uint)bVar3) + 0x20 + (uint)bVar1 + iVar22 >> 6);
        }
        auVar43._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar41);
        auVar43._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar56);
        auVar44 = packssdw(auVar43,auVar43);
        auVar42._8_4_ = 0xffffffff;
        auVar42._0_8_ = 0xffffffffffffffff;
        auVar42._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar44 ^ auVar42,auVar44 ^ auVar42);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          local_138[lVar30 + 2] =
               (byte)((uint)bVar3 * 0x40 + (uint)bVar3 * -2 + 0x20 + (uint)bVar1 * 2 + iVar22 >> 6);
        }
        auVar42 = (auVar39 | auVar37) ^ _DAT_001721d0;
        auVar57._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar42._0_8_);
        auVar57._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar42._8_8_);
        auVar44 = packssdw(auVar57,auVar57);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44 ^ auVar5,auVar44 ^ auVar5);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 3] = (byte)(uVar27 * 3 + (uint)bVar3 * 0x3d + 0x20 + iVar22 >> 6);
        }
        auVar58._0_8_ = -(ulong)(auVar42._0_8_ < -0x7fffffffffffffc1);
        auVar58._8_8_ = -(ulong)(auVar42._8_8_ < -0x7fffffffffffffc1);
        auVar42 = pshufhw(auVar42,auVar58,0x84);
        auVar42 = packssdw(auVar42,auVar42);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 4] = (byte)((uint)bVar3 * 0x3c + (uint)bVar1 * 4 + 0x20 + iVar22 >> 6);
        }
        auVar42 = (auVar39 | auVar36) ^ _DAT_001721d0;
        lVar41 = auVar42._0_8_;
        auVar59._0_8_ = -(ulong)(lVar41 < -0x7fffffffffffffc1);
        lVar56 = auVar42._8_8_;
        auVar59._8_8_ = -(ulong)(lVar56 < -0x7fffffffffffffc1);
        auVar42 = pshuflw(auVar59,auVar59,0xe8);
        auVar42 = packssdw(auVar42,auVar42);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 5] = (byte)((uint)bVar3 * 0x3b + (uint)bVar1 * 5 + 0x20 + iVar22 >> 6);
        }
        auVar45._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar41);
        auVar45._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar56);
        auVar42 = packssdw(auVar45,auVar45);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar6,auVar42 ^ auVar6);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 6] = (byte)((uint)bVar3 * 0x3a + (uint)bVar1 * 6 + 0x20 + iVar22 >> 6);
        }
        auVar42 = (auVar39 | auVar35) ^ _DAT_001721d0;
        auVar60._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar42._0_8_);
        auVar60._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar42._8_8_);
        auVar44 = packssdw(auVar60,auVar60);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44 ^ auVar7,auVar44 ^ auVar7);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 7] =
               (byte)(((uint)bVar1 * 8 - (uint)bVar1) + (uint)bVar3 * 0x39 + 0x20 + iVar22 >> 6);
        }
        auVar61._0_8_ = -(ulong)(auVar42._0_8_ < -0x7fffffffffffffc1);
        auVar61._8_8_ = -(ulong)(auVar42._8_8_ < -0x7fffffffffffffc1);
        auVar42 = pshufhw(auVar42,auVar61,0x84);
        auVar42 = packssdw(auVar42,auVar42);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 8] = (byte)((uint)bVar3 * 0x38 + (uint)bVar1 * 8 + 0x20 + iVar22 >> 6);
        }
        auVar42 = (auVar39 | auVar34) ^ _DAT_001721d0;
        lVar41 = auVar42._0_8_;
        auVar62._0_8_ = -(ulong)(lVar41 < -0x7fffffffffffffc1);
        lVar56 = auVar42._8_8_;
        auVar62._8_8_ = -(ulong)(lVar56 < -0x7fffffffffffffc1);
        auVar42 = pshuflw(auVar62,auVar62,0xe8);
        auVar42 = packssdw(auVar42,auVar42);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138[lVar30 + 9] = (byte)((uint)bVar3 * 0x37 + (uint)bVar1 * 9 + 0x20 + iVar22 >> 6);
        }
        auVar46._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar41);
        auVar46._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar56);
        auVar42 = packssdw(auVar46,auVar46);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar8,auVar42 ^ auVar8);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          local_138[lVar30 + 10] = (byte)((uint)bVar3 * 0x36 + iVar4 + 0x20 + iVar22 >> 6);
        }
        auVar42 = (auVar39 | auVar33) ^ _DAT_001721d0;
        auVar63._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar42._0_8_);
        auVar63._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar42._8_8_);
        auVar44 = packssdw(auVar63,auVar63);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar44 = packssdw(auVar44 ^ auVar9,auVar44 ^ auVar9);
        auVar44 = packsswb(auVar44,auVar44);
        if ((auVar44 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 0xb] =
               (byte)((uint)bVar3 * 0x35 + iVar4 + (uint)bVar1 + 0x20 + iVar22 >> 6);
        }
        auVar64._0_8_ = -(ulong)(auVar42._0_8_ < -0x7fffffffffffffc1);
        auVar64._8_8_ = -(ulong)(auVar42._8_8_ < -0x7fffffffffffffc1);
        auVar42 = pshufhw(auVar42,auVar64,0x84);
        auVar42 = packssdw(auVar42,auVar42);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 0xc] = (byte)((uint)bVar3 * 0x34 + uVar27 * 0xc + 0x20 + iVar22 >> 6);
        }
        auVar42 = (auVar39 | auVar32) ^ _DAT_001721d0;
        lVar41 = auVar42._0_8_;
        auVar65._0_8_ = -(ulong)(lVar41 < -0x7fffffffffffffc1);
        lVar56 = auVar42._8_8_;
        auVar65._8_8_ = -(ulong)(lVar56 < -0x7fffffffffffffc1);
        auVar42 = pshuflw(auVar65,auVar65,0xe8);
        auVar42 = packssdw(auVar42,auVar42);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 0xd] =
               (byte)((uint)bVar3 * 0x33 + uVar27 * 0xc + (uint)bVar1 + 0x20 + iVar22 >> 6);
        }
        auVar47._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar41);
        auVar47._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar56);
        auVar42 = packssdw(auVar47,auVar47);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar10,auVar42 ^ auVar10);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 0xe] =
               (byte)(iVar23 + (uint)bVar1 * -2 + (uint)bVar3 * 0x32 + 0x20 + iVar22 >> 6);
        }
        auVar39 = (auVar39 | auVar31) ^ _DAT_001721d0;
        auVar48._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar39._0_8_);
        auVar48._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar39._8_8_);
        auVar42 = packssdw(auVar48,auVar48);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar11,auVar42 ^ auVar11);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 0xf] =
               (byte)((uint)bVar3 * 0x31 + (uint)bVar1 * 0xf + 0x20 + iVar22 >> 6);
        }
        auVar49._0_8_ = -(ulong)(auVar39._0_8_ < -0x7fffffffffffffc1);
        auVar49._8_8_ = -(ulong)(auVar39._8_8_ < -0x7fffffffffffffc1);
        auVar39 = pshufhw(auVar39,auVar49,0x84);
        auVar39 = packssdw(auVar39,auVar39);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          local_138[lVar30 + 0x10] = (byte)((uint)bVar3 * 0x30 + iVar23 + 0x20 + iVar22 >> 6);
        }
        lVar30 = lVar30 + 0x10;
        iVar22 = iVar22 + iVar23 + (uint)bVar3 * -0x10;
      } while (lVar30 != 0x40);
      iVar22 = (uint)bVar2 * 0x10;
      iVar23 = (uint)bVar2 * 0xc;
      iVar4 = (uint)bVar2 * 10;
      uVar20 = (uint)bVar2;
      iVar29 = 0;
      uVar24 = 0;
      do {
        auVar40._8_4_ = (int)uVar24;
        auVar40._0_8_ = uVar24;
        auVar40._12_4_ = (int)(uVar24 >> 0x20);
        auVar39 = (auVar40 | auVar38) ^ _DAT_001721d0;
        lVar30 = auVar39._0_8_;
        auVar66._0_8_ = -(ulong)(lVar30 < -0x7fffffffffffffc1);
        lVar41 = auVar39._8_8_;
        auVar66._8_8_ = -(ulong)(lVar41 < -0x7fffffffffffffc1);
        auVar39 = pshuflw(auVar66,auVar66,0xe8);
        auVar39 = packssdw(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x41] =
               (byte)(((uint)bVar1 * 0x40 - (uint)bVar1) + uVar20 + 0x20 + iVar29 >> 6);
        }
        auVar50._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar30);
        auVar50._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar41);
        auVar39 = packssdw(auVar50,auVar50);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar39 = packssdw(auVar39 ^ auVar12,auVar39 ^ auVar12);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x42] =
               (byte)((uint)bVar1 * 0x40 + (uint)bVar1 * -2 + uVar20 * 2 + 0x20 + iVar29 >> 6);
        }
        auVar39 = (auVar40 | auVar37) ^ _DAT_001721d0;
        auVar67._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar39._0_8_);
        auVar67._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar39._8_8_);
        auVar42 = packssdw(auVar67,auVar67);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar13,auVar42 ^ auVar13);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x43] =
               (byte)((uint)bVar2 * 3 + (uint)bVar1 * 0x3d + 0x20 + iVar29 >> 6);
        }
        auVar68._0_8_ = -(ulong)(auVar39._0_8_ < -0x7fffffffffffffc1);
        auVar68._8_8_ = -(ulong)(auVar39._8_8_ < -0x7fffffffffffffc1);
        auVar39 = pshufhw(auVar39,auVar68,0x84);
        auVar39 = packssdw(auVar39,auVar39);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x44] = (byte)((uint)bVar1 * 0x3c + uVar20 * 4 + 0x20 + iVar29 >> 6);
        }
        auVar39 = (auVar40 | auVar36) ^ _DAT_001721d0;
        lVar30 = auVar39._0_8_;
        auVar69._0_8_ = -(ulong)(lVar30 < -0x7fffffffffffffc1);
        lVar41 = auVar39._8_8_;
        auVar69._8_8_ = -(ulong)(lVar41 < -0x7fffffffffffffc1);
        auVar39 = pshuflw(auVar69,auVar69,0xe8);
        auVar39 = packssdw(auVar39,auVar39);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x45] =
               (byte)((uint)bVar2 * 5 + (uint)bVar1 * 0x3b + 0x20 + iVar29 >> 6);
        }
        auVar51._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar30);
        auVar51._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar41);
        auVar39 = packssdw(auVar51,auVar51);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar39 = packssdw(auVar39 ^ auVar14,auVar39 ^ auVar14);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x46] = (byte)((uint)bVar1 * 0x3a + uVar20 * 6 + 0x20 + iVar29 >> 6);
        }
        auVar39 = (auVar40 | auVar35) ^ _DAT_001721d0;
        auVar70._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar39._0_8_);
        auVar70._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar39._8_8_);
        auVar42 = packssdw(auVar70,auVar70);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar15,auVar42 ^ auVar15);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x47] =
               (byte)((uint)bVar1 * 0x39 + ((uint)bVar2 * 8 - uVar20) + 0x20 + iVar29 >> 6);
        }
        auVar71._0_8_ = -(ulong)(auVar39._0_8_ < -0x7fffffffffffffc1);
        auVar71._8_8_ = -(ulong)(auVar39._8_8_ < -0x7fffffffffffffc1);
        auVar39 = pshufhw(auVar39,auVar71,0x84);
        auVar39 = packssdw(auVar39,auVar39);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x48] =
               (byte)(iVar29 + (uint)bVar1 * 0x38 + (uint)bVar2 * 8 + 0x20 >> 6);
        }
        auVar39 = (auVar40 | auVar34) ^ _DAT_001721d0;
        lVar30 = auVar39._0_8_;
        auVar72._0_8_ = -(ulong)(lVar30 < -0x7fffffffffffffc1);
        lVar41 = auVar39._8_8_;
        auVar72._8_8_ = -(ulong)(lVar41 < -0x7fffffffffffffc1);
        auVar39 = pshuflw(auVar72,auVar72,0xe8);
        auVar39 = packssdw(auVar39,auVar39);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x49] =
               (byte)(iVar29 + (uint)bVar1 * 0x37 + (uint)bVar2 * 9 + 0x20 >> 6);
        }
        auVar52._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar30);
        auVar52._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar41);
        auVar39 = packssdw(auVar52,auVar52);
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        auVar39 = packssdw(auVar39 ^ auVar16,auVar39 ^ auVar16);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x4a] = (byte)(iVar29 + (uint)bVar1 * 0x36 + iVar4 + 0x20 >> 6);
        }
        auVar39 = (auVar40 | auVar33) ^ _DAT_001721d0;
        auVar73._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar39._0_8_);
        auVar73._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar39._8_8_);
        auVar42 = packssdw(auVar73,auVar73);
        auVar17._8_4_ = 0xffffffff;
        auVar17._0_8_ = 0xffffffffffffffff;
        auVar17._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar17,auVar42 ^ auVar17);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x4b] =
               (byte)(iVar29 + (uint)bVar1 * 0x35 + iVar4 + (uint)bVar2 + 0x20 >> 6);
        }
        auVar74._0_8_ = -(ulong)(auVar39._0_8_ < -0x7fffffffffffffc1);
        auVar74._8_8_ = -(ulong)(auVar39._8_8_ < -0x7fffffffffffffc1);
        auVar39 = pshufhw(auVar39,auVar74,0x84);
        auVar39 = packssdw(auVar39,auVar39);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x4c] = (byte)(iVar29 + (uint)bVar1 * 0x34 + iVar23 + 0x20 >> 6);
        }
        auVar39 = (auVar40 | auVar32) ^ _DAT_001721d0;
        lVar30 = auVar39._0_8_;
        auVar75._0_8_ = -(ulong)(lVar30 < -0x7fffffffffffffc1);
        lVar41 = auVar39._8_8_;
        auVar75._8_8_ = -(ulong)(lVar41 < -0x7fffffffffffffc1);
        auVar39 = pshuflw(auVar75,auVar75,0xe8);
        auVar39 = packssdw(auVar39,auVar39);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x4d] =
               (byte)(iVar29 + (uint)bVar1 * 0x33 + iVar23 + (uint)bVar2 + 0x20 >> 6);
        }
        auVar53._0_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar30);
        auVar53._8_8_ = -(ulong)(-0x7fffffffffffffc2 < lVar41);
        auVar39 = packssdw(auVar53,auVar53);
        auVar18._8_4_ = 0xffffffff;
        auVar18._0_8_ = 0xffffffffffffffff;
        auVar18._12_4_ = 0xffffffff;
        auVar39 = packssdw(auVar39 ^ auVar18,auVar39 ^ auVar18);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x4e] =
               (byte)(iVar29 + iVar22 + (uint)bVar2 * -2 + (uint)bVar1 * 0x32 + 0x20 >> 6);
        }
        auVar39 = (auVar40 | auVar31) ^ _DAT_001721d0;
        auVar54._0_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar39._0_8_);
        auVar54._8_8_ = -(ulong)(-0x7fffffffffffffc2 < auVar39._8_8_);
        auVar42 = packssdw(auVar54,auVar54);
        auVar19._8_4_ = 0xffffffff;
        auVar19._0_8_ = 0xffffffffffffffff;
        auVar19._12_4_ = 0xffffffff;
        auVar42 = packssdw(auVar42 ^ auVar19,auVar42 ^ auVar19);
        auVar42 = packsswb(auVar42,auVar42);
        if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_138[uVar24 | 0x4f] =
               (byte)(iVar29 + (uint)bVar1 * 0x31 + (uint)bVar2 * 0xf + 0x20 >> 6);
        }
        auVar55._0_8_ = -(ulong)(auVar39._0_8_ < -0x7fffffffffffffc1);
        auVar55._8_8_ = -(ulong)(auVar39._8_8_ < -0x7fffffffffffffc1);
        auVar39 = pshufhw(auVar39,auVar55,0x84);
        auVar39 = packssdw(auVar39,auVar39);
        auVar39 = packsswb(auVar39,auVar39);
        if ((auVar39 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
          auStack_e8[uVar24] = (char)(iVar29 + uVar27 * 0x30 + iVar22 + 0x20 >> 6);
        }
        uVar24 = uVar24 + 0x10;
        iVar29 = iVar29 + iVar22 + (uint)bVar1 * -0x10;
      } while (uVar24 != 0x40);
      goto LAB_0015e3b5;
    }
  }
  else {
    local_138[0] = *pu1_src;
    uVar27 = (uint)local_138[0];
    local_138[(int)uVar26] = pu1_src[(int)uVar26];
    if (nt < 1) goto LAB_0015e3b5;
  }
  uVar24 = 1;
  if (1 < (int)(uVar26 - 1)) {
    uVar24 = (ulong)(uVar26 - 1);
  }
  uVar25 = 0;
  do {
    bVar1 = pu1_src[uVar25 + 1];
    local_138[uVar25 + 1] = (byte)(uVar27 + (uint)bVar1 * 2 + (uint)pu1_src[uVar25 + 2] + 2 >> 2);
    uVar25 = uVar25 + 1;
    uVar27 = (uint)bVar1;
  } while (uVar24 != uVar25);
LAB_0015e3b5:
  if (-1 < nt) {
    uVar27 = 0;
    if (0 < (int)uVar26) {
      uVar27 = uVar26;
    }
    memcpy(pu1_dst,local_138,(ulong)(uVar27 | 1));
  }
  return;
}

Assistant:

void ihevc_intra_pred_ref_filtering(UWORD8 *pu1_src,
                                    WORD32 nt,
                                    UWORD8 *pu1_dst,
                                    WORD32 mode,
                                    WORD32 strong_intra_smoothing_enable_flag)
{
    WORD32 filter_flag;
    WORD32 i; /* Generic indexing variable */
    WORD32 four_nt = 4 * nt;
    UWORD8 au1_flt[(4 * MAX_CU_SIZE) + 1];
    WORD32 bi_linear_int_flag = 0;
    WORD32 abs_cond_left_flag = 0;
    WORD32 abs_cond_top_flag = 0;
    /*WORD32 dc_val = 1 << (BIT_DEPTH - 5);*/
    WORD32 dc_val = 1 << (8 - 5);
    //WORD32 strong_intra_smoothing_enable_flag  = 1;

    filter_flag = gau1_intra_pred_ref_filter[mode] & (1 << (CTZ(nt) - 2));
    if(0 == filter_flag)
    {
        if(pu1_src == pu1_dst)
        {
            return;
        }
        else
        {
            for(i = 0; i < (four_nt + 1); i++)
                pu1_dst[i] = pu1_src[i];
        }
    }

    else
    {
        /* If strong intra smoothin is enabled and transform size is 32 */
        if((1 == strong_intra_smoothing_enable_flag) && (32 == nt))
        {
            /* Strong Intra Filtering */
            abs_cond_top_flag = (ABS(pu1_src[2 * nt] + pu1_src[4 * nt]
                            - (2 * pu1_src[3 * nt]))) < dc_val;
            abs_cond_left_flag = (ABS(pu1_src[2 * nt] + pu1_src[0]
                            - (2 * pu1_src[nt]))) < dc_val;

            bi_linear_int_flag = ((1 == abs_cond_left_flag)
                            && (1 == abs_cond_top_flag));
        }
        /* Extremities Untouched*/
        au1_flt[0] = pu1_src[0];
        au1_flt[4 * nt] = pu1_src[4 * nt];

        /* Strong filtering of reference samples */
        if(1 == bi_linear_int_flag)
        {
            au1_flt[2 * nt] = pu1_src[2 * nt];

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i] = (((2 * nt) - i) * pu1_src[0] + i * pu1_src[2 * nt] + 32) >> 6;

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i + (2 * nt)] = (((2 * nt) - i) * pu1_src[2 * nt] + i * pu1_src[4 * nt] + 32) >> 6;

        }
        else
        {
            /* Perform bilinear filtering of Reference Samples */
            for(i = 0; i < (four_nt - 1); i++)
            {
                au1_flt[i + 1] = (pu1_src[i] + 2 * pu1_src[i + 1]
                                + pu1_src[i + 2] + 2) >> 2;
            }
        }


        for(i = 0; i < (four_nt + 1); i++)
            pu1_dst[i] = au1_flt[i];
    }

}